

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueDescriptorProto::unsafe_arena_set_allocated_options
          (EnumValueDescriptorProto *this,EnumValueOptions *options)

{
  void *pvVar1;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x18);
  }
  if ((pvVar1 == (void *)0x0) && (this->options_ != (EnumValueOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  this->options_ = options;
  (this->_has_bits_).has_bits_[0] =
       ((this->_has_bits_).has_bits_[0] & 0xfffffffd) +
       (uint)(options != (EnumValueOptions *)0x0) * 2;
  return;
}

Assistant:

void EnumValueDescriptorProto::unsafe_arena_set_allocated_options(
    PROTOBUF_NAMESPACE_ID::EnumValueOptions* options) {
  if (GetArenaNoVirtual() == nullptr) {
    delete options_;
  }
  options_ = options;
  if (options) {
    _has_bits_[0] |= 0x00000002u;
  } else {
    _has_bits_[0] &= ~0x00000002u;
  }
  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:google.protobuf.EnumValueDescriptorProto.options)
}